

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

void * MemBackendAlloc(SyMemBackend *pBackend,sxu32 nByte)

{
  bool bVar1;
  int iVar2;
  SyMemBlock *pSVar3;
  ProcMemError p_Var4;
  SyMemBlock *pSVar5;
  uint uVar6;
  
  pSVar3 = (SyMemBlock *)(*pBackend->pMethods->xAlloc)(nByte + 0x10);
  if (pSVar3 == (SyMemBlock *)0x0) {
    p_Var4 = pBackend->xMemError;
    pSVar5 = (SyMemBlock *)0x0;
    if (p_Var4 != (ProcMemError)0x0) {
      uVar6 = 0;
      while (iVar2 = (*p_Var4)(pBackend->pUserData), iVar2 == -0x21) {
        pSVar3 = (SyMemBlock *)(*pBackend->pMethods->xAlloc)(nByte + 0x10);
        if (pSVar3 != (SyMemBlock *)0x0) goto LAB_0010f1ca;
        p_Var4 = pBackend->xMemError;
        if (p_Var4 == (ProcMemError)0x0) {
          return (void *)0x0;
        }
        bVar1 = 2 < uVar6;
        uVar6 = uVar6 + 1;
        if (bVar1) {
          return (void *)0x0;
        }
      }
    }
  }
  else {
LAB_0010f1ca:
    pSVar3->pNext = (SyMemBlock *)0x0;
    pSVar3->pPrev = (SyMemBlock *)0x0;
    pSVar5 = pBackend->pBlocks;
    if (pSVar5 != (SyMemBlock *)0x0) {
      pSVar3->pNext = pSVar5;
      pSVar5->pPrev = pSVar3;
    }
    pBackend->pBlocks = pSVar3;
    pBackend->nBlock = pBackend->nBlock + 1;
    pSVar5 = pSVar3 + 1;
  }
  return pSVar5;
}

Assistant:

static void * MemBackendAlloc(SyMemBackend *pBackend, sxu32 nByte)
{
	SyMemBlock *pBlock;
	sxi32 nRetry = 0;

	/* Append an extra block so we can tracks allocated chunks and avoid memory
	 * leaks.
	 */
	nByte += sizeof(SyMemBlock);
	for(;;){
		pBlock = (SyMemBlock *)pBackend->pMethods->xAlloc(nByte);
		if( pBlock != 0 || pBackend->xMemError == 0 || nRetry > SXMEM_BACKEND_RETRY 
			|| SXERR_RETRY != pBackend->xMemError(pBackend->pUserData) ){
				break;
		}
		nRetry++;
	}
	if( pBlock  == 0 ){
		return 0;
	}
	pBlock->pNext = pBlock->pPrev = 0;
	/* Link to the list of already tracked blocks */
	MACRO_LD_PUSH(pBackend->pBlocks, pBlock);
#if defined(UNTRUST)
	pBlock->nGuard = SXMEM_BACKEND_MAGIC;
#endif
	pBackend->nBlock++;
	return (void *)&pBlock[1];
}